

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O3

int __thiscall
deqp::gles31::Functional::anon_unknown_1::OuterEdgeVertexSetIndexIndependenceCase::init
          (OuterEdgeVertexSetIndexIndependenceCase *this,EVP_PKEY_CTX *ctx)

{
  deInt32 *pdVar1;
  Context *pCVar2;
  RenderContext *renderCtx;
  SharedPtrStateBase *pSVar3;
  RenderTarget *pRVar4;
  long *plVar5;
  ShaderProgram *this_00;
  SharedPtrStateBase *pSVar6;
  ContextInfo *extraout_RAX;
  ContextInfo *pCVar7;
  TestError *this_01;
  pointer pbVar8;
  Context *code;
  long lVar9;
  undefined1 in_R9B;
  deInt32 *pdVar10;
  string tessellationEvaluationTemplate;
  string fragmentShaderTemplate;
  string tessellationControlTemplate;
  string vertexShaderTemplate;
  undefined1 local_2e0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2d0;
  Context *local_2b8;
  long local_2b0;
  undefined1 local_2a8 [16];
  ContextInfo *local_298;
  long local_290;
  undefined1 local_288 [16];
  pointer local_278;
  undefined1 local_268 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_258;
  undefined1 local_248 [16];
  ContextInfo *local_238;
  undefined1 local_228 [24];
  pointer local_210;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_208;
  uint local_1f8;
  value_type local_1f0;
  uint local_1d0;
  value_type local_1c8;
  uint local_1a8;
  value_type local_1a0;
  value_type local_180;
  string local_160;
  string local_140;
  string local_120;
  undefined1 local_100 [24];
  pointer pbStack_e8;
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_70;
  deUint32 local_58;
  undefined1 local_50 [32];
  
  checkTessellationSupport((this->super_TestCase).m_context);
  pRVar4 = Context::getRenderTarget((this->super_TestCase).m_context);
  checkRenderTargetSize
            ((Functional *)(ulong)(uint)pRVar4->m_width,
             (RenderTarget *)(ulong)(uint)pRVar4->m_height,0x10);
  local_238 = (ContextInfo *)local_228;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_238,
             "${GLSL_VERSION_DECL}\n\nin highp float in_v_attr;\nout highp float in_tc_attr;\n\nvoid main (void)\n{\n\tin_tc_attr = in_v_attr;\n}\n"
             ,"");
  local_258._M_allocated_capacity = (size_type)local_248;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(local_268 + 0x10),
             "${GLSL_VERSION_DECL}\n${TESSELLATION_SHADER_REQUIRE}\n\nlayout (vertices = 1) out;\n\nin highp float in_tc_attr[];\n\nvoid main (void)\n{\n\tgl_TessLevelInner[0] = in_tc_attr[0];\n\tgl_TessLevelInner[1] = in_tc_attr[1];\n\n\tgl_TessLevelOuter[0] = in_tc_attr[2];\n\tgl_TessLevelOuter[1] = in_tc_attr[3];\n\tgl_TessLevelOuter[2] = in_tc_attr[4];\n\tgl_TessLevelOuter[3] = in_tc_attr[5];\n}\n"
             ,"");
  Functional::(anonymous_namespace)::getTessellationEvaluationInLayoutString_abi_cxx11_
            ((string *)local_2e0,(_anonymous_namespace_ *)(ulong)this->m_primitiveType,
             this->m_spacing,this->m_winding,(uint)this->m_usePointMode,(bool)in_R9B);
  plVar5 = (long *)std::__cxx11::string::replace((ulong)local_2e0,0,(char *)0x0,0x1c4562f);
  pbVar8 = (pointer)(plVar5 + 2);
  if ((pointer)*plVar5 == pbVar8) {
    local_100._16_8_ = (pbVar8->_M_dataplus)._M_p;
    pbStack_e8 = (pointer)plVar5[3];
    local_100._0_8_ = (pointer)(local_100 + 0x10);
  }
  else {
    local_100._16_8_ = (pbVar8->_M_dataplus)._M_p;
    local_100._0_8_ = (pointer)*plVar5;
  }
  local_100._8_8_ = plVar5[1];
  *plVar5 = (long)pbVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append(local_100);
  local_2b8 = (Context *)local_2a8;
  code = (Context *)(plVar5 + 2);
  if ((Context *)*plVar5 == code) {
    local_2a8._0_8_ = code->m_testCtx;
    local_2a8._8_8_ = plVar5[3];
  }
  else {
    local_2a8._0_8_ = code->m_testCtx;
    local_2b8 = (Context *)*plVar5;
  }
  local_2b0 = plVar5[1];
  *plVar5 = (long)code;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  if ((pointer)local_100._0_8_ != (pointer)(local_100 + 0x10)) {
    operator_delete((void *)local_100._0_8_,
                    (ulong)((long)&((_Alloc_hider *)local_100._16_8_)->_M_p + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_2e0._4_4_,local_2e0._0_4_) != &local_2d0) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT44(local_2e0._4_4_,local_2e0._0_4_),local_2d0._M_allocated_capacity + 1
                   );
  }
  local_278 = (pointer)local_268;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_278,
             "${GLSL_VERSION_DECL}\n\nlayout (location = 0) out mediump vec4 o_color;\n\nin highp vec4 in_f_color;\n\nvoid main (void)\n{\n\to_color = in_f_color;\n}\n"
             ,"");
  this_00 = (ShaderProgram *)operator_new(0xd0);
  pCVar2 = (this->super_TestCase).m_context;
  renderCtx = pCVar2->m_renderCtx;
  memset(local_100,0,0xac);
  local_50._0_8_ = (pointer)0x0;
  local_50[8] = 0;
  local_50._9_7_ = 0;
  local_50[0x10] = 0;
  local_50._17_8_ = 0;
  Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
            ((string *)(local_228 + 0x10),(_anonymous_namespace_ *)pCVar2->m_renderCtx,
             (Context *)local_238,(char *)code);
  local_2e0._0_4_ = 0;
  local_2e0._8_8_ = local_2d0._M_local_buf + 8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(local_2e0 + 8),local_228._16_8_,
             (char *)(local_228._16_8_ + (long)&local_210->_M_dataplus));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_100 + (ulong)(uint)local_2e0._0_4_ * 0x18),(value_type *)(local_2e0 + 8));
  Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_120,(_anonymous_namespace_ *)((this->super_TestCase).m_context)->m_renderCtx,
             (Context *)local_258._M_allocated_capacity,(char *)code);
  local_1a8 = 3;
  local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1a0,local_120._M_dataplus._M_p,
             local_120._M_dataplus._M_p + local_120._M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_100 + (ulong)local_1a8 * 0x18),&local_1a0);
  Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_140,(_anonymous_namespace_ *)((this->super_TestCase).m_context)->m_renderCtx,
             local_2b8,(char *)code);
  local_1d0 = 4;
  local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1c8,local_140._M_dataplus._M_p,
             local_140._M_dataplus._M_p + local_140._M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_100 + (ulong)local_1d0 * 0x18),&local_1c8);
  Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_160,(_anonymous_namespace_ *)((this->super_TestCase).m_context)->m_renderCtx,
             (Context *)local_278,(char *)code);
  local_1f8 = 1;
  local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1f0,local_160._M_dataplus._M_p,
             local_160._M_dataplus._M_p + local_160._M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_100 + (ulong)local_1f8 * 0x18),&local_1f0);
  local_298 = (ContextInfo *)local_288;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,"out_te_tessCoord","");
  local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_180,local_298,
             (undefined1 *)((long)&local_298->_vptr_ContextInfo + local_290));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_50,&local_180);
  local_58 = 0x8c8c;
  glu::ShaderProgram::ShaderProgram(this_00,renderCtx,(ProgramSources *)local_100);
  pSVar6 = (SharedPtrStateBase *)operator_new(0x20);
  pdVar1 = &pSVar6->strongRefCount;
  pSVar6->strongRefCount = 0;
  pSVar6->weakRefCount = 0;
  pSVar6->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_02137b98;
  pSVar6[1]._vptr_SharedPtrStateBase = (_func_int **)this_00;
  pSVar6->strongRefCount = 1;
  pSVar6->weakRefCount = 1;
  pSVar3 = (this->m_program).m_state;
  if (pSVar3 != pSVar6) {
    if (pSVar3 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar10 = &pSVar3->strongRefCount;
      *pdVar10 = *pdVar10 + -1;
      UNLOCK();
      if (*pdVar10 == 0) {
        (this->m_program).m_ptr = (ShaderProgram *)0x0;
        (*((this->m_program).m_state)->_vptr_SharedPtrStateBase[2])();
      }
      LOCK();
      pdVar10 = &((this->m_program).m_state)->weakRefCount;
      *pdVar10 = *pdVar10 + -1;
      UNLOCK();
      if (*pdVar10 == 0) {
        pSVar3 = (this->m_program).m_state;
        if (pSVar3 != (SharedPtrStateBase *)0x0) {
          (*pSVar3->_vptr_SharedPtrStateBase[1])();
        }
        (this->m_program).m_state = (SharedPtrStateBase *)0x0;
      }
    }
    (this->m_program).m_ptr = this_00;
    (this->m_program).m_state = pSVar6;
    LOCK();
    pSVar6->strongRefCount = pSVar6->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar10 = &((this->m_program).m_state)->weakRefCount;
    *pdVar10 = *pdVar10 + 1;
    UNLOCK();
  }
  pdVar10 = &pSVar6->weakRefCount;
  LOCK();
  *pdVar1 = *pdVar1 + -1;
  UNLOCK();
  if (*pdVar1 == 0) {
    (*pSVar6->_vptr_SharedPtrStateBase[2])(pSVar6);
  }
  LOCK();
  *pdVar10 = *pdVar10 + -1;
  UNLOCK();
  if (*pdVar10 == 0) {
    (*pSVar6->_vptr_SharedPtrStateBase[1])(pSVar6);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._M_dataplus._M_p != &local_180.field_2) {
    operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
  }
  if (local_298 != (ContextInfo *)local_288) {
    operator_delete(local_298,local_288._0_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != &local_160.field_2) {
    operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_dataplus._M_p != &local_140.field_2) {
    operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
    operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != &local_120.field_2) {
    operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
  }
  if ((char *)local_2e0._8_8_ != local_2d0._M_local_buf + 8) {
    operator_delete((void *)local_2e0._8_8_,local_2d0._8_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._16_8_ != &local_208) {
    operator_delete((void *)local_228._16_8_,local_208._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_50);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_70);
  lVar9 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_100 + lVar9));
    lVar9 = lVar9 + -0x18;
  } while (lVar9 != -0x18);
  glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
                  (this->m_program).m_ptr);
  if ((((this->m_program).m_ptr)->m_program).m_info.linkOk != false) {
    if (local_278 != (pointer)local_268) {
      operator_delete(local_278,(ulong)(local_268._0_8_ + 1));
    }
    if (local_2b8 != (Context *)local_2a8) {
      operator_delete(local_2b8,(ulong)((long)(Platform **)local_2a8._0_8_ + 1));
    }
    if ((ContextInfo *)local_258._M_allocated_capacity != (ContextInfo *)local_248) {
      operator_delete((void *)local_258._M_allocated_capacity,
                      (ulong)((long)(Platform **)local_248._0_8_ + 1));
    }
    pCVar7 = (ContextInfo *)local_228;
    if (local_238 != pCVar7) {
      operator_delete(local_238,(ulong)((long)(Platform **)local_228._0_8_ + 1));
      pCVar7 = extraout_RAX;
    }
    return (int)pCVar7;
  }
  this_01 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_01,"Program compilation failed",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationTests.cpp"
             ,0x11cc);
  __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void OuterEdgeVertexSetIndexIndependenceCase::init (void)
{
	checkTessellationSupport(m_context);
	checkRenderTargetSize(m_context.getRenderTarget(), RENDER_SIZE);

	std::string vertexShaderTemplate			("${GLSL_VERSION_DECL}\n"
												 "\n"
												 "in highp float in_v_attr;\n"
												 "out highp float in_tc_attr;\n"
												 "\n"
												 "void main (void)\n"
												 "{\n"
												 "	in_tc_attr = in_v_attr;\n"
												 "}\n");
	std::string tessellationControlTemplate		("${GLSL_VERSION_DECL}\n"
												 "${TESSELLATION_SHADER_REQUIRE}\n"
												 "\n"
												 "layout (vertices = 1) out;\n"
												 "\n"
												 "in highp float in_tc_attr[];\n"
												 "\n"
												 "void main (void)\n"
												 "{\n"
												 "	gl_TessLevelInner[0] = in_tc_attr[0];\n"
												 "	gl_TessLevelInner[1] = in_tc_attr[1];\n"
												 "\n"
												 "	gl_TessLevelOuter[0] = in_tc_attr[2];\n"
												 "	gl_TessLevelOuter[1] = in_tc_attr[3];\n"
												 "	gl_TessLevelOuter[2] = in_tc_attr[4];\n"
												 "	gl_TessLevelOuter[3] = in_tc_attr[5];\n"
												 "}\n");
	std::string tessellationEvaluationTemplate	("${GLSL_VERSION_DECL}\n"
												 "${TESSELLATION_SHADER_REQUIRE}\n"
												 "\n"
												 + getTessellationEvaluationInLayoutString(m_primitiveType, m_spacing, m_winding, m_usePointMode) +
												 "\n"
												 "out highp vec4 in_f_color;\n"
												 "out highp vec3 out_te_tessCoord;\n"
												 "\n"
												 "void main (void)\n"
												 "{\n"
												 "	out_te_tessCoord = gl_TessCoord;"
												 "	gl_Position = vec4(gl_TessCoord.xy, 0.0, 1.0);\n"
												 "	in_f_color = vec4(1.0);\n"
												 "}\n");
	std::string fragmentShaderTemplate			("${GLSL_VERSION_DECL}\n"
												 "\n"
												 "layout (location = 0) out mediump vec4 o_color;\n"
												 "\n"
												 "in highp vec4 in_f_color;\n"
												 "\n"
												 "void main (void)\n"
												 "{\n"
												 "	o_color = in_f_color;\n"
												 "}\n");

	m_program = SharedPtr<const ShaderProgram>(new ShaderProgram(m_context.getRenderContext(), glu::ProgramSources()
		<< glu::VertexSource					(specializeShader(m_context, vertexShaderTemplate.c_str()))
		<< glu::TessellationControlSource		(specializeShader(m_context, tessellationControlTemplate.c_str()))
		<< glu::TessellationEvaluationSource	(specializeShader(m_context, tessellationEvaluationTemplate.c_str()))
		<< glu::FragmentSource					(specializeShader(m_context, fragmentShaderTemplate.c_str()))
		<< glu::TransformFeedbackVarying		("out_te_tessCoord")
		<< glu::TransformFeedbackMode			(GL_INTERLEAVED_ATTRIBS)));

	m_testCtx.getLog() << *m_program;
	if (!m_program->isOk())
		TCU_FAIL("Program compilation failed");
}